

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_urbg.cc
# Opt level: O2

result_type_conflict3
absl::lts_20250127::random_internal::RandenPool<unsigned_short>::Generate(void)

{
  size_t sVar1;
  uint32_t uVar2;
  RandenPoolEntry *this;
  SpinLockHolder l;
  SpinLockHolder local_10;
  
  this = anon_unknown_0::GetPoolForCurrentThread();
  local_10.lock_ = &this->mu_;
  base_internal::SpinLock::Lock(local_10.lock_);
  anon_unknown_0::RandenPoolEntry::MaybeRefill(this);
  sVar1 = this->next_;
  this->next_ = sVar1 + 1;
  uVar2 = this->state_[sVar1];
  base_internal::SpinLockHolder::~SpinLockHolder(&local_10);
  return (result_type_conflict3)uVar2;
}

Assistant:

typename RandenPool<T>::result_type RandenPool<T>::Generate() {
  auto* pool = GetPoolForCurrentThread();
  return pool->Generate<T>();
}